

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

ArenaBlock * __thiscall
google::protobuf::internal::ThreadSafeArena::FirstBlock(ThreadSafeArena *this,void *buf,size_t size)

{
  string *psVar1;
  undefined1 *puVar2;
  uint local_2c;
  ulong local_28 [2];
  
  local_28[0] = (ulong)((uint)buf & 7);
  local_2c = 0;
  psVar1 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_long,unsigned_int>
                     (local_28,&local_2c,"reinterpret_cast<uintptr_t>(buf) & 7 == 0u");
  if (psVar1 == (string *)0x0) {
    if (size < 0x11 || buf == (void *)0x0) {
      puVar2 = (anonymous_namespace)::SentryArenaBlock()::kSentryArenaBlock;
    }
    else {
      *(byte *)&(this->alloc_policy_).policy_ = (byte)(this->alloc_policy_).policy_ | 1;
      ArenaBlock::ArenaBlock((ArenaBlock *)buf,(ArenaBlock *)0x0,size);
      puVar2 = (undefined1 *)buf;
    }
    return (ArenaBlock *)puVar2;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/arena.cc"
             ,0x245,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

ArenaBlock* ThreadSafeArena::FirstBlock(void* buf, size_t size) {
  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(buf) & 7, 0u);
  if (buf == nullptr || size <= kBlockHeaderSize) {
    return SentryArenaBlock();
  }
  // Record user-owned block.
  alloc_policy_.set_is_user_owned_initial_block(true);
  return new (buf) ArenaBlock{nullptr, size};
}